

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_encode_se(aec_stream *strm)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  internal_state *piVar4;
  uint8_t *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  code *pcVar13;
  
  piVar4 = strm->state;
  iVar8 = piVar4->id_len;
  iVar7 = piVar4->bits;
  if (iVar8 < iVar7) {
    iVar7 = iVar7 - (iVar8 + 1);
    piVar4->bits = iVar7;
    *piVar4->cds = *piVar4->cds + (char)(1 << ((byte)iVar7 & 0x1f));
  }
  else {
    iVar10 = (iVar8 + 1) - iVar7;
    puVar5 = piVar4->cds;
    piVar4->cds = puVar5 + 1;
    *puVar5 = *puVar5 + (char)(1L >> ((byte)iVar10 & 0x3f));
    if (8 < iVar10) {
      iVar8 = (iVar8 - iVar7) + 9;
      do {
        iVar10 = iVar8;
        puVar5 = piVar4->cds;
        piVar4->cds = puVar5 + 1;
        *puVar5 = (uint8_t)(1 >> ((char)iVar10 - 0x10U & 0x1f));
        iVar8 = iVar10 + -8;
      } while (0x10 < iVar10 + -8);
      iVar10 = iVar10 + -0x10;
    }
    piVar4->bits = 8 - iVar10;
    *piVar4->cds = (uint8_t)(1 << ((byte)(8 - iVar10) & 0x1f));
  }
  if (piVar4->ref != 0) {
    iVar8 = piVar4->bits;
    uVar11 = piVar4->ref_sample;
    uVar1 = strm->bits_per_sample;
    if (iVar8 < (int)uVar1) {
      iVar8 = uVar1 - iVar8;
      puVar5 = piVar4->cds;
      piVar4->cds = puVar5 + 1;
      *puVar5 = *puVar5 + (char)(uVar11 >> ((byte)iVar8 & 0x3f));
      iVar7 = iVar8;
      if (8 < iVar8) {
        do {
          iVar8 = iVar7 + -8;
          puVar5 = piVar4->cds;
          piVar4->cds = puVar5 + 1;
          *puVar5 = (uint8_t)(uVar11 >> ((byte)iVar8 & 0x1f));
          bVar6 = 0x10 < iVar7;
          iVar7 = iVar8;
        } while (bVar6);
      }
      piVar4->bits = 8 - iVar8;
      *piVar4->cds = (uint8_t)(uVar11 << ((byte)(8 - iVar8) & 0x1f));
    }
    else {
      piVar4->bits = iVar8 - uVar1;
      *piVar4->cds = *piVar4->cds + (char)(uVar11 << ((byte)(iVar8 - uVar1) & 0x1f));
    }
  }
  if (strm->block_size != 0) {
    uVar9 = 0;
    do {
      uVar2 = piVar4->block[uVar9];
      uVar3 = piVar4->block[uVar9 + 1];
      uVar11 = ((uVar3 + uVar2 + 1) * (uVar3 + uVar2) >> 1) + uVar3;
      iVar8 = piVar4->bits;
      if (iVar8 <= (int)uVar11) {
        do {
          uVar11 = uVar11 - iVar8;
          puVar5 = piVar4->cds;
          piVar4->cds = puVar5 + 1;
          puVar5[1] = '\0';
          piVar4->bits = 8;
          iVar8 = 8;
        } while (7 < (int)uVar11);
      }
      piVar4->bits = ~uVar11 + iVar8;
      *piVar4->cds = *piVar4->cds + (char)(1 << ((byte)(~uVar11 + iVar8) & 0x1f));
      uVar9 = uVar9 + 2;
    } while (uVar9 < strm->block_size);
  }
  piVar4 = strm->state;
  if (piVar4->direct_out == 0) {
    piVar4->i = 0;
    pcVar13 = m_flush_block_resumable;
  }
  else {
    lVar12 = (long)(*(int *)&piVar4->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar12;
    strm->avail_out = strm->avail_out - lVar12;
    pcVar13 = m_get_block;
  }
  piVar4->mode = pcVar13;
  return (int)piVar4;
}

Assistant:

static int m_encode_se(struct aec_stream *strm)
{
    size_t i;
    uint32_t d;
    struct internal_state *state = strm->state;

    emit(state, 1, state->id_len + 1);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    for (i = 0; i < strm->block_size; i+= 2) {
        d = state->block[i] + state->block[i + 1];
        emitfs(state, d * (d + 1) / 2 + state->block[i + 1]);
    }

    return m_flush_block(strm);
}